

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O0

Vec_Int_t * Gia_ManCollectPath(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *vPath_00;
  Gia_Obj_t *local_30;
  Vec_Int_t *vPath;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  vPath_00 = Vec_IntAlloc(p->nLevels);
  iVar1 = Gia_ObjIsCo(pObj);
  local_30 = pObj;
  if (iVar1 != 0) {
    local_30 = Gia_ObjFanin0(pObj);
  }
  Gia_ManCollectPath_rec(p,local_30,vPath_00);
  return vPath_00;
}

Assistant:

Vec_Int_t * Gia_ManCollectPath( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Vec_Int_t * vPath = Vec_IntAlloc( p->nLevels );
    Gia_ManCollectPath_rec( p, Gia_ObjIsCo(pObj) ? Gia_ObjFanin0(pObj) : pObj, vPath );
    return vPath;
}